

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_tests.cpp
# Opt level: O2

void __thiscall key_tests::bip341_test_h::test_method(bip341_test_h *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vch;
  const_string file;
  const_string msg;
  char *local_160;
  char *local_158;
  assertion_result local_150;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 local_118 [24];
  char **local_100;
  XOnlyPubKey H;
  HashWriter hw;
  array<std::byte,_65UL> G_uncompressed;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&G_uncompressed,&DAT_00bb28cb,0x41);
  CSHA256::CSHA256(&hw.ctx);
  CSHA256::Write(&hw.ctx,G_uncompressed._M_elems,0x41);
  HashWriter::GetSHA256((uint256 *)local_118,(HashWriter *)&hw.ctx);
  vch.m_size = 0x20;
  vch.m_data = (uchar *)local_118;
  base_blob<256U>::base_blob((base_blob<256U> *)&H,vch);
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_tests.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x16b;
  file.m_begin = (iterator)&local_128;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==((base_blob<256U> *)&XOnlyPubKey::NUMS_H,(base_blob<256U> *)&H);
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = &local_160;
  local_160 = "XOnlyPubKey::NUMS_H == H";
  local_158 = "";
  local_118[8] = false;
  local_118._0_8_ = &PTR__lazy_ostream_011481f0;
  local_118._16_8_ = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,(lazy_ostream *)local_118,1,0,WARN,0xbb0ae4,(size_t)&stack0xfffffffffffffe90
             ,0x16b);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bip341_test_h)
{
    constexpr auto G_uncompressed{"0479be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798483ada7726a3c4655da4fbfc0e1108a8fd17b448a68554199c47d08ffb10d4b8"_hex};
    HashWriter hw;
    hw.write(G_uncompressed);
    XOnlyPubKey H{hw.GetSHA256()};
    BOOST_CHECK(XOnlyPubKey::NUMS_H == H);
}